

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bond.cpp
# Opt level: O0

undefined8 __thiscall indigox::Bond::ToString_abi_cxx11_(Bond *this)

{
  bool bVar1;
  element_type *peVar2;
  uid_t uVar3;
  ostream *poVar4;
  undefined8 in_RDI;
  Atom_p tmp_1;
  Atom_p tmp;
  stringstream ss;
  Atom *in_stack_fffffffffffffd78;
  array<std::weak_ptr<indigox::Atom>,_2UL> *in_stack_fffffffffffffd80;
  weak_ptr<indigox::Atom> *in_stack_fffffffffffffd88;
  string local_208 [48];
  string local_1d8 [64];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"Bond(");
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
            (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
  bVar1 = std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)0x10e33e);
  if (bVar1) {
    std::operator<<(local_188,"\"None\"");
  }
  else {
    std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
              (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
    std::weak_ptr<indigox::Atom>::lock(in_stack_fffffffffffffd88);
    peVar2 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10e384);
    uVar3 = Atom::GetIndex(peVar2);
    poVar4 = (ostream *)std::ostream::operator<<(local_188,uVar3);
    poVar4 = std::operator<<(poVar4,":\"");
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10e3ce);
    Atom::GetName_abi_cxx11_(in_stack_fffffffffffffd78);
    poVar4 = std::operator<<(poVar4,local_1d8);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string(local_1d8);
    std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x10e426);
  }
  std::operator<<(local_188,",");
  std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
            (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
  bVar1 = std::__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::expired
                    ((__weak_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *)0x10e4d3);
  if (bVar1) {
    std::operator<<(local_188,"\"None\"");
  }
  else {
    std::array<std::weak_ptr<indigox::Atom>,_2UL>::operator[]
              (in_stack_fffffffffffffd80,(size_type)in_stack_fffffffffffffd78);
    std::weak_ptr<indigox::Atom>::lock(in_stack_fffffffffffffd88);
    peVar2 = std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10e51a);
    uVar3 = Atom::GetIndex(peVar2);
    poVar4 = (ostream *)std::ostream::operator<<(local_188,uVar3);
    poVar4 = std::operator<<(poVar4,":\"");
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10e564);
    Atom::GetName_abi_cxx11_(in_stack_fffffffffffffd78);
    poVar4 = std::operator<<(poVar4,local_208);
    std::operator<<(poVar4,"\"");
    std::__cxx11::string::~string(local_208);
    std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x10e5bc);
  }
  std::operator<<(local_188,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

String Bond::ToString() const {
    std::stringstream ss;
    ss << "Bond(";
    if (!atoms_[0].expired()) {
      Atom_p tmp = atoms_[0].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ",";
    if (!atoms_[1].expired()) {
      Atom_p tmp = atoms_[1].lock();
      ss << tmp->GetIndex() << ":\"" << tmp->GetName() << "\"";
    } else {
      ss << "\"None\"";
    }
    ss << ")";
    return ss.str();
  }